

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void ws_read_finish(nni_ws *ws)

{
  uint32_t *puVar1;
  int iVar2;
  nng_err result;
  nni_aio *pnVar3;
  ws_frame *pwVar4;
  size_t sVar5;
  void *pvVar6;
  nni_list *pnVar7;
  ulong __n;
  uint local_3c;
  nni_msg *pnStack_38;
  uint niov;
  nni_iov *iov;
  
  if (ws->isstream == true) {
    pnVar3 = (nni_aio *)nni_list_first(&ws->recvq);
    if (pnVar3 != (nni_aio *)0x0) {
      pnVar7 = &ws->rxq;
      do {
        pwVar4 = (ws_frame *)nni_list_first(pnVar7);
        if (pwVar4 == (ws_frame *)0x0) {
          return;
        }
        if (pwVar4->len == 0) {
          nni_list_remove(pnVar7,pwVar4);
          ws_frame_fini(pwVar4);
        }
        else {
          nni_aio_list_remove(pnVar3);
          nni_aio_get_iov(pnVar3,&local_3c,(nni_iov **)&stack0xffffffffffffffc8);
          do {
            if (local_3c == 0) break;
            __n = *(ulong *)(pnStack_38->m_header_buf + 2);
            if (pwVar4->len < *(ulong *)(pnStack_38->m_header_buf + 2)) {
              __n = pwVar4->len;
            }
            if (__n != 0) {
              memcpy(*(void **)pnStack_38->m_header_buf,pwVar4->buf,__n);
              *(ulong *)pnStack_38->m_header_buf = *(long *)pnStack_38->m_header_buf + __n;
              puVar1 = pnStack_38->m_header_buf + 2;
              *(ulong *)puVar1 = *(long *)puVar1 - __n;
              if (*(long *)puVar1 == 0) {
                pnStack_38 = (nni_msg *)(pnStack_38->m_header_buf + 4);
                local_3c = local_3c - 1;
              }
            }
            sVar5 = pwVar4->len - __n;
            if (sVar5 == 0) {
              nni_list_remove(pnVar7,pwVar4);
              ws_frame_fini(pwVar4);
              pwVar4 = (ws_frame *)nni_list_first(pnVar7);
            }
            else {
              pwVar4->len = sVar5;
              pwVar4->buf = pwVar4->buf + __n;
            }
            nni_aio_bump_count(pnVar3,__n);
          } while (pwVar4 != (ws_frame *)0x0);
          sVar5 = nni_aio_count(pnVar3);
          nni_aio_finish(pnVar3,NNG_OK,sVar5);
        }
        pnVar3 = (nni_aio *)nni_list_first(&ws->recvq);
      } while (pnVar3 != (nni_aio *)0x0);
    }
  }
  else if (ws->inmsg == false) {
    pnVar7 = &ws->rxq;
    iVar2 = nni_list_empty(pnVar7);
    if ((iVar2 == 0) && (pnVar3 = (nni_aio *)nni_list_first(&ws->recvq), pnVar3 != (nni_aio *)0x0))
    {
      pvVar6 = nni_list_first(pnVar7);
      sVar5 = 0;
      for (; pvVar6 != (void *)0x0; pvVar6 = nni_list_next(pnVar7,pvVar6)) {
        sVar5 = sVar5 + *(long *)((long)pvVar6 + 0xa8);
      }
      nni_aio_list_remove(pnVar3);
      result = nni_msg_alloc(&stack0xffffffffffffffc8,sVar5);
      if (result == NNG_OK) {
        pvVar6 = nni_msg_body(pnStack_38);
        pwVar4 = (ws_frame *)nni_list_first(pnVar7);
        while (pwVar4 != (ws_frame *)0x0) {
          nni_list_remove(pnVar7,pwVar4);
          memcpy(pvVar6,pwVar4->buf,pwVar4->len);
          pvVar6 = (void *)((long)pvVar6 + pwVar4->len);
          ws_frame_fini(pwVar4);
          pwVar4 = (ws_frame *)nni_list_first(pnVar7);
        }
        nni_aio_set_msg(pnVar3,pnStack_38);
        sVar5 = nni_msg_len(pnStack_38);
        nni_aio_bump_count(pnVar3,sVar5);
        sVar5 = nni_msg_len(pnStack_38);
        nni_aio_finish(pnVar3,NNG_OK,sVar5);
      }
      else {
        nni_aio_finish_error(pnVar3,result);
        nni_mtx_lock(&ws->mtx);
        ws_close(ws,0x3f3);
        nni_mtx_unlock(&ws->mtx);
      }
    }
  }
  return;
}

Assistant:

static void
ws_read_finish(nni_ws *ws)
{
	if (ws->isstream) {
		ws_read_finish_str(ws);
	} else {
		ws_read_finish_msg(ws);
	}
}